

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiColumns::Clear(ImGuiColumns *this)

{
  ImGuiColumnData *ptr;
  
  this->Current = 0;
  this->Count = 1;
  this->ID = 0;
  this->Flags = 0;
  this->IsFirstFrame = false;
  this->IsBeingResized = false;
  this->OffMinX = 0.0;
  this->OffMaxX = 0.0;
  this->LineMinY = 0.0;
  this->LineMaxY = 0.0;
  this->HostCursorPosY = 0.0;
  this->HostCursorMaxPosX = 0.0;
  ptr = (this->Columns).Data;
  if (ptr != (ImGuiColumnData *)0x0) {
    (this->Columns).Size = 0;
    (this->Columns).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->Columns).Data = (ImGuiColumnData *)0x0;
  }
  return;
}

Assistant:

void Clear()
    {
        ID = 0;
        Flags = ImGuiColumnsFlags_None;
        IsFirstFrame = false;
        IsBeingResized = false;
        Current = 0;
        Count = 1;
        OffMinX = OffMaxX = 0.0f;
        LineMinY = LineMaxY = 0.0f;
        HostCursorPosY = 0.0f;
        HostCursorMaxPosX = 0.0f;
        Columns.clear();
    }